

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O0

size_t __thiscall event_track::EventSample::size(EventSample *this)

{
  size_type sVar1;
  reference this_00;
  size_t sVar2;
  uint local_24;
  size_t sStack_20;
  uint32_t k;
  size_t l_size;
  EventSample *this_local;
  
  if (((this->is_emeb_ & 1U) == 0) &&
     (sVar1 = std::
              vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
              ::size(&this->instance_boxes_), sVar1 != 0)) {
    sStack_20 = 0;
    for (local_24 = 0;
        sVar1 = std::
                vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                ::size(&this->instance_boxes_), local_24 < sVar1; local_24 = local_24 + 1) {
      this_00 = std::
                vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                ::operator[](&this->instance_boxes_,(ulong)local_24);
      sVar2 = EventMessageInstanceBox::size(this_00);
      sStack_20 = sStack_20 + (sVar2 & 0xffffffff);
    }
    return sStack_20;
  }
  return 8;
}

Assistant:

std::size_t size()
		{
			if(is_emeb_ || instance_boxes_.size() == 0)
			   return 8;
			else 
			{
				size_t l_size = 0;

				for (uint32_t k = 0; k < instance_boxes_.size(); k++)
					l_size += (uint32_t)instance_boxes_[k].size();

				return l_size;
			}   
		}